

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitSequencingExpression(SyntaxDumper *this,SequencingExpressionSyntax *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SyntaxToken local_50;
  
  iVar1 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xd9])(node)
  ;
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,CONCAT44(extraout_var,iVar1));
  (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xda])
            (&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  iVar1 = (*(node->super_ExpressionSyntax).super_SyntaxNode.super_Managed._vptr_Managed[0xdb])(node)
  ;
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,CONCAT44(extraout_var_00,iVar1));
  return Skip;
}

Assistant:

virtual Action visitSequencingExpression(const SequencingExpressionSyntax* node) override
    {
        nonterminal(node->left());
        terminal(node->operatorToken(), node);
        nonterminal(node->right());
        return Action::Skip;
    }